

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::AppendGlobalTargetDepends
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmGeneratorTarget *target)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetDependSet *pTVar2;
  cmLocalUnixMakefileGenerator3 *this_01;
  _Base_ptr p_Var3;
  string tgtName;
  string local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  pTVar2 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
  for (p_Var3 = (pTVar2->
                super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 !=
      &(pTVar2->
       super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t.
       _M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    this_00 = *(cmGeneratorTarget **)(p_Var3 + 1);
    bVar1 = cmGeneratorTarget::IsInBuildSystem(this_00);
    if (bVar1) {
      this_01 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(this_00);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                (&local_d0,this_01,this_00);
      local_80.View_._M_len = local_d0._M_string_length;
      local_80.View_._M_str = local_d0._M_dataplus._M_p;
      local_b0.View_._M_len = 4;
      local_b0.View_._M_str = "/all";
      cmStrCat<>(&local_50,&local_80,&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(depends,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AppendGlobalTargetDepends(
  std::vector<std::string>& depends, cmGeneratorTarget* target)
{
  for (cmTargetDepend const& i : this->GetTargetDirectDepends(target)) {
    // Create the target-level dependency.
    cmGeneratorTarget const* dep = i;
    if (!dep->IsInBuildSystem()) {
      continue;
    }
    cmLocalUnixMakefileGenerator3* lg3 =
      static_cast<cmLocalUnixMakefileGenerator3*>(dep->GetLocalGenerator());
    std::string tgtName = cmStrCat(
      lg3->GetRelativeTargetDirectory(const_cast<cmGeneratorTarget*>(dep)),
      "/all");
    depends.push_back(tgtName);
  }
}